

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_plu_det(matd_plu_t *mlu)

{
  matd_t *pmVar1;
  uint local_24;
  double dStack_20;
  int i;
  double det;
  matd_t *lu;
  matd_plu_t *mlu_local;
  
  pmVar1 = mlu->lu;
  dStack_20 = (double)mlu->pivsign;
  if (pmVar1->nrows == pmVar1->ncols) {
    for (local_24 = 0; local_24 < pmVar1->ncols; local_24 = local_24 + 1) {
      dStack_20 = (double)pmVar1[(ulong)(local_24 * pmVar1->ncols + local_24) + 1] * dStack_20;
    }
  }
  return dStack_20;
}

Assistant:

double matd_plu_det(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    double det = mlu->pivsign;

    if (lu->nrows == lu->ncols) {
        for (int i = 0; i < lu->ncols; i++)
            det *= MATD_EL(lu, i, i);
    }

    return det;
}